

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O3

uchar * stbi_write_png_to_mem(uchar *pixels,int stride_bytes,int x,int y,int n,int *out_len)

{
  int iVar1;
  int *piVar2;
  uchar *puVar3;
  uchar uVar4;
  int iVar5;
  int iVar6;
  uchar *puVar7;
  char *line_buffer;
  uchar *__src;
  ulong uVar8;
  size_t __n;
  int data_len;
  int filter_type;
  byte bVar9;
  int iVar10;
  uint uVar11;
  ulong uVar13;
  int filter_type_00;
  int zlen;
  ulong local_68;
  uchar *local_60;
  int *local_58;
  ulong local_50;
  long local_48;
  size_t local_40;
  uchar *local_38;
  ulong uVar12;
  
  iVar1 = stbi_write_force_png_filter;
  uVar11 = n * x;
  uVar12 = (ulong)uVar11;
  if (stride_bytes == 0) {
    stride_bytes = uVar11;
  }
  iVar5 = -1;
  if (stbi_write_force_png_filter < 5) {
    iVar5 = stbi_write_force_png_filter;
  }
  data_len = (uVar11 + 1) * y;
  local_60 = pixels;
  puVar7 = (uchar *)malloc((long)data_len);
  if (puVar7 != (uchar *)0x0) {
    local_40 = (size_t)(int)uVar11;
    line_buffer = (char *)malloc(local_40);
    if (line_buffer == (char *)0x0) {
      free(puVar7);
    }
    else {
      local_68 = uVar12;
      local_58 = out_len;
      if (0 < y) {
        local_48 = (long)(int)(uVar11 + 1);
        local_50 = (ulong)(uint)y;
        uVar13 = 0;
        do {
          filter_type = iVar5;
          iVar10 = iVar1;
          if (iVar5 < 0) {
            filter_type = 0;
            iVar10 = 0x7fffffff;
            filter_type_00 = 0;
            do {
              stbiw__encode_png_line
                        (local_60,stride_bytes,x,y,(int)uVar13,n,filter_type_00,line_buffer);
              iVar6 = 0;
              if (0 < (int)local_68) {
                uVar8 = 0;
                iVar6 = 0;
                do {
                  bVar9 = line_buffer[uVar8] >> 7;
                  iVar6 = iVar6 + (uint)(byte)((line_buffer[uVar8] ^ bVar9) - bVar9);
                  uVar8 = uVar8 + 1;
                } while (uVar12 != uVar8);
              }
              if (iVar6 < iVar10) {
                iVar10 = iVar6;
                filter_type = filter_type_00;
              }
              filter_type_00 = filter_type_00 + 1;
            } while (filter_type_00 != 5);
            uVar4 = '\x05';
            iVar10 = filter_type;
            if (filter_type != 5) goto LAB_00103a64;
          }
          else {
LAB_00103a64:
            stbiw__encode_png_line(local_60,stride_bytes,x,y,(int)uVar13,n,filter_type,line_buffer);
            uVar4 = (uchar)iVar10;
          }
          puVar7[uVar13 * local_48] = uVar4;
          memcpy(puVar7 + uVar13 * local_48 + 1,line_buffer,local_40);
          uVar13 = uVar13 + 1;
        } while (uVar13 != local_50);
      }
      free(line_buffer);
      __src = stbi_zlib_compress(puVar7,data_len,&zlen,stbi_write_png_compression_level);
      free(puVar7);
      if (__src != (uchar *)0x0) {
        __n = (size_t)zlen;
        puVar7 = (uchar *)malloc(__n + 0x39);
        piVar2 = local_58;
        if (puVar7 != (uchar *)0x0) {
          *local_58 = (int)(__n + 0x39);
          puVar7[0] = 0x89;
          puVar7[1] = 'P';
          puVar7[2] = 'N';
          puVar7[3] = 'G';
          puVar7[4] = '\r';
          puVar7[5] = '\n';
          puVar7[6] = '\x1a';
          puVar7[7] = '\n';
          puVar7[8] = '\0';
          puVar7[9] = '\0';
          puVar7[10] = '\0';
          puVar7[0xb] = '\r';
          puVar7[0xc] = 'I';
          puVar7[0xd] = 'H';
          puVar7[0xe] = 'D';
          puVar7[0xf] = 'R';
          puVar7[0x10] = (uchar)((uint)x >> 0x18);
          puVar7[0x11] = (uchar)((uint)x >> 0x10);
          puVar7[0x12] = (uchar)((uint)x >> 8);
          puVar7[0x13] = (uchar)x;
          puVar7[0x14] = (uchar)((uint)y >> 0x18);
          puVar7[0x15] = (uchar)((uint)y >> 0x10);
          puVar7[0x16] = (uchar)((uint)y >> 8);
          puVar7[0x17] = (uchar)y;
          puVar7[0x18] = '\b';
          puVar7[0x19] = (&DAT_00106290)[(long)n * 4];
          puVar7[0x1a] = '\0';
          puVar7[0x1b] = '\0';
          local_38 = puVar7 + 0x1d;
          puVar7[0x1c] = '\0';
          stbiw__wpcrc(&local_38,0xd);
          puVar3 = local_38;
          *local_38 = (uchar)((uint)zlen >> 0x18);
          local_38[1] = (uchar)((uint)zlen >> 0x10);
          local_38[2] = (uchar)((uint)zlen >> 8);
          local_38[3] = (uchar)zlen;
          local_38[4] = 'I';
          local_38[5] = 'D';
          local_38[6] = 'A';
          local_38[7] = 'T';
          memmove(local_38 + 8,__src,__n);
          local_38 = puVar3 + __n + 8;
          free(__src);
          stbiw__wpcrc(&local_38,zlen);
          local_38[0] = '\0';
          local_38[1] = '\0';
          local_38[2] = '\0';
          local_38[3] = '\0';
          local_38[4] = 'I';
          local_38[5] = 'E';
          local_38[6] = 'N';
          local_38[7] = 'D';
          local_38 = local_38 + 8;
          stbiw__wpcrc(&local_38,0);
          if (local_38 == puVar7 + *piVar2) {
            return puVar7;
          }
          __assert_fail("o == out + *out_len",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sps1112[P]pathfinder-2d/includes/stb_image_write.h"
                        ,0x49b,
                        "unsigned char *stbi_write_png_to_mem(const unsigned char *, int, int, int, int, int *)"
                       );
        }
      }
    }
  }
  return (uchar *)0x0;
}

Assistant:

STBIWDEF unsigned char *stbi_write_png_to_mem(const unsigned char *pixels, int stride_bytes, int x, int y, int n, int *out_len)
{
   int force_filter = stbi_write_force_png_filter;
   int ctype[5] = { -1, 0, 4, 2, 6 };
   unsigned char sig[8] = { 137,80,78,71,13,10,26,10 };
   unsigned char *out,*o, *filt, *zlib;
   signed char *line_buffer;
   int j,zlen;

   if (stride_bytes == 0)
      stride_bytes = x * n;

   if (force_filter >= 5) {
      force_filter = -1;
   }

   filt = (unsigned char *) STBIW_MALLOC((x*n+1) * y); if (!filt) return 0;
   line_buffer = (signed char *) STBIW_MALLOC(x * n); if (!line_buffer) { STBIW_FREE(filt); return 0; }
   for (j=0; j < y; ++j) {
      int filter_type;
      if (force_filter > -1) {
         filter_type = force_filter;
         stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, force_filter, line_buffer);
      } else { // Estimate the best filter by running through all of them:
         int best_filter = 0, best_filter_val = 0x7fffffff, est, i;
         for (filter_type = 0; filter_type < 5; filter_type++) {
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, filter_type, line_buffer);

            // Estimate the entropy of the line using this filter; the less, the better.
            est = 0;
            for (i = 0; i < x*n; ++i) {
               est += abs((signed char) line_buffer[i]);
            }
            if (est < best_filter_val) {
               best_filter_val = est;
               best_filter = filter_type;
            }
         }
         if (filter_type != best_filter) {  // If the last iteration already got us the best filter, don't redo it
            stbiw__encode_png_line((unsigned char*)(pixels), stride_bytes, x, y, j, n, best_filter, line_buffer);
            filter_type = best_filter;
         }
      }
      // when we get here, filter_type contains the filter type, and line_buffer contains the data
      filt[j*(x*n+1)] = (unsigned char) filter_type;
      STBIW_MEMMOVE(filt+j*(x*n+1)+1, line_buffer, x*n);
   }
   STBIW_FREE(line_buffer);
   zlib = stbi_zlib_compress(filt, y*( x*n+1), &zlen, stbi_write_png_compression_level);
   STBIW_FREE(filt);
   if (!zlib) return 0;

   // each tag requires 12 bytes of overhead
   out = (unsigned char *) STBIW_MALLOC(8 + 12+13 + 12+zlen + 12);
   if (!out) return 0;
   *out_len = 8 + 12+13 + 12+zlen + 12;

   o=out;
   STBIW_MEMMOVE(o,sig,8); o+= 8;
   stbiw__wp32(o, 13); // header length
   stbiw__wptag(o, "IHDR");
   stbiw__wp32(o, x);
   stbiw__wp32(o, y);
   *o++ = 8;
   *o++ = STBIW_UCHAR(ctype[n]);
   *o++ = 0;
   *o++ = 0;
   *o++ = 0;
   stbiw__wpcrc(&o,13);

   stbiw__wp32(o, zlen);
   stbiw__wptag(o, "IDAT");
   STBIW_MEMMOVE(o, zlib, zlen);
   o += zlen;
   STBIW_FREE(zlib);
   stbiw__wpcrc(&o, zlen);

   stbiw__wp32(o,0);
   stbiw__wptag(o, "IEND");
   stbiw__wpcrc(&o,0);

   STBIW_ASSERT(o == out + *out_len);

   return out;
}